

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O2

void __thiscall
AVSInterface::AVSInDelegator::Read
          (AVSInDelegator *this,char *name,vector<long,_std::allocator<long>_> *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  AVSValue *pAVar4;
  undefined8 *puVar5;
  int index;
  AVSValue arg;
  long local_30;
  
  iVar2 = NameToIndex(this,name);
  pAVar4 = AVSValue::operator[](&this->_args,iVar2);
  AVSValue::AVSValue(&arg,pAVar4);
  bVar1 = AVSValue::IsArray(&arg);
  if (bVar1) {
    iVar2 = AVSValue::ArraySize(&arg);
    if (*(long *)(output + 8) != *(long *)output) {
      *(long *)(output + 8) = *(long *)output;
    }
    index = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (; iVar2 != index; index = index + 1) {
      pAVar4 = AVSValue::operator[](&arg,index);
      iVar3 = AVSValue::AsInt(pAVar4);
      local_30 = (long)iVar3;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(output,&local_30);
    }
    AVSValue::~AVSValue(&arg);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Argument is not array";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void Read(const char* name, std::vector<int64_t>& output) override {
      auto arg = _args[NameToIndex(name)];
      if (!arg.IsArray())
        throw "Argument is not array";
      auto size = arg.ArraySize();
      output.clear();
      for (int i = 0; i < size; i++)
        output.push_back(arg[i].AsInt());
    }